

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ExpressionCoverageBinInitializerSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExpressionCoverageBinInitializerSyntax,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,ExpressionSyntax *args)

{
  ExpressionCoverageBinInitializerSyntax *pEVar1;
  
  pEVar1 = (ExpressionCoverageBinInitializerSyntax *)
           ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ExpressionCoverageBinInitializerSyntax *)this->endPtr < pEVar1 + 1) {
    pEVar1 = (ExpressionCoverageBinInitializerSyntax *)allocateSlow(this,0x18,8);
  }
  else {
    this->head->current = (byte *)(pEVar1 + 1);
  }
  (pEVar1->super_CoverageBinInitializerSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pEVar1->super_CoverageBinInitializerSyntax).super_SyntaxNode.kind =
       ExpressionCoverageBinInitializer;
  (pEVar1->expr).ptr = args;
  (args->super_SyntaxNode).parent = (SyntaxNode *)pEVar1;
  return pEVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }